

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O1

bool __thiscall
QNativeSocketEnginePrivate::fetchConnectionParameters(QNativeSocketEnginePrivate *this)

{
  QHostAddress *this_00;
  QHostAddress *this_01;
  bool bVar1;
  int iVar2;
  int *piVar3;
  NetworkLayerProtocol NVar4;
  SocketType SVar5;
  long in_FS_OFFSET;
  socklen_t valueSize;
  int value;
  socklen_t optlen;
  int ipv6only;
  socklen_t sockAddrSize;
  socklen_t local_6c;
  int local_68;
  socklen_t local_64;
  int local_60 [2];
  qt_sockaddr local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  (this->super_QAbstractSocketEnginePrivate).localPort = 0;
  this_00 = &(this->super_QAbstractSocketEnginePrivate).localAddress;
  QHostAddress::clear(this_00);
  (this->super_QAbstractSocketEnginePrivate).peerPort = 0;
  this_01 = &(this->super_QAbstractSocketEnginePrivate).peerAddress;
  QHostAddress::clear(this_01);
  (this->super_QAbstractSocketEnginePrivate).inboundStreamCount = 0;
  (this->super_QAbstractSocketEnginePrivate).outboundStreamCount = 0;
  if (this->socketDescriptor == -1) goto LAB_002342ff;
  local_60[1] = 0x1c;
  local_58._0_8_ = 0;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_58._16_4_ = 0;
  local_58._20_8_ = 0;
  iVar2 = getsockname((int)this->socketDescriptor,(sockaddr *)&local_58.a,
                      (socklen_t *)(local_60 + 1));
  if (iVar2 == 0) {
    qt_socket_getPortAndAddress
              (&local_58,&(this->super_QAbstractSocketEnginePrivate).localPort,this_00);
    NVar4 = IPv4Protocol;
    if (local_58.a.sa_family != 2) {
      NVar4 = (uint)(local_58.a.sa_family == 10) * 2 + UnknownNetworkLayerProtocol;
    }
    (this->super_QAbstractSocketEnginePrivate).socketProtocol = NVar4;
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 == 9) {
      setError(this,UnsupportedSocketOperationError,InvalidSocketErrorString);
      bVar1 = false;
      goto LAB_002342ff;
    }
  }
  local_60[0] = 0;
  local_64 = 4;
  if ((this->super_QAbstractSocketEnginePrivate).socketProtocol == IPv6Protocol) {
    bVar1 = QHostAddress::operator==(this_00,AnyIPv4);
    if (!bVar1) {
      bVar1 = QHostAddress::operator==(this_00,AnyIPv6);
      if (!bVar1) goto LAB_0023426d;
    }
    iVar2 = getsockopt((int)this->socketDescriptor,0x29,0x1a,local_60,&local_64);
    if (iVar2 == 0) {
      if (local_64 != 4) {
        fetchConnectionParameters();
      }
      if (local_60[0] == 0) {
        (this->super_QAbstractSocketEnginePrivate).socketProtocol = AnyIPProtocol;
        QHostAddress::operator=(this_00,Any);
      }
    }
  }
LAB_0023426d:
  iVar2 = getpeername((int)this->socketDescriptor,(sockaddr *)&local_58.a,
                      (socklen_t *)(local_60 + 1));
  if (iVar2 == 0) {
    qt_socket_getPortAndAddress
              (&local_58,&(this->super_QAbstractSocketEnginePrivate).peerPort,this_01);
    (this->super_QAbstractSocketEnginePrivate).inboundStreamCount = 1;
    (this->super_QAbstractSocketEnginePrivate).outboundStreamCount = 1;
  }
  local_68 = 0;
  local_6c = 4;
  iVar2 = getsockopt((int)this->socketDescriptor,1,3,&local_68,&local_6c);
  if (iVar2 == 0) {
    SVar5 = TcpSocket;
    if (local_68 != 1) {
      SVar5 = (uint)(local_68 == 2) * 2 + UnknownSocketType;
    }
    (this->super_QAbstractSocketEnginePrivate).socketType = SVar5;
  }
  bVar1 = true;
LAB_002342ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::fetchConnectionParameters()
{
    localPort = 0;
    localAddress.clear();
    peerPort = 0;
    peerAddress.clear();
    inboundStreamCount = outboundStreamCount = 0;

    if (socketDescriptor == -1)
        return false;

    qt_sockaddr sa;
    QT_SOCKLEN_T sockAddrSize = sizeof(sa);

    // Determine local address
    memset(&sa, 0, sizeof(sa));
    if (::getsockname(socketDescriptor, &sa.a, &sockAddrSize) == 0) {
        qt_socket_getPortAndAddress(&sa, &localPort, &localAddress);

        // Determine protocol family
        switch (sa.a.sa_family) {
        case AF_INET:
            socketProtocol = QAbstractSocket::IPv4Protocol;
            break;
        case AF_INET6:
            socketProtocol = QAbstractSocket::IPv6Protocol;
            break;
        default:
            socketProtocol = QAbstractSocket::UnknownNetworkLayerProtocol;
            break;
        }

    } else if (errno == EBADF) {
        setError(QAbstractSocket::UnsupportedSocketOperationError, InvalidSocketErrorString);
        return false;
    }

#if defined (IPV6_V6ONLY)
    // determine if local address is dual mode
    // On linux, these are returned as "::" (==AnyIPv6)
    // On OSX, these are returned as "::FFFF:0.0.0.0" (==AnyIPv4)
    // in either case, the IPV6_V6ONLY option is cleared
    int ipv6only = 0;
    socklen_t optlen = sizeof(ipv6only);
    if (socketProtocol == QAbstractSocket::IPv6Protocol
        && (localAddress == QHostAddress::AnyIPv4 || localAddress == QHostAddress::AnyIPv6)
        && !getsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_V6ONLY, (char*)&ipv6only, &optlen )) {
            if (optlen != sizeof(ipv6only))
                qWarning("unexpected size of IPV6_V6ONLY socket option");
            if (!ipv6only) {
                socketProtocol = QAbstractSocket::AnyIPProtocol;
                localAddress = QHostAddress::Any;
            }
    }
#endif

    // Determine the remote address
    bool connected = ::getpeername(socketDescriptor, &sa.a, &sockAddrSize) == 0;
    if (connected) {
        qt_socket_getPortAndAddress(&sa, &peerPort, &peerAddress);
        inboundStreamCount = outboundStreamCount = 1;
    }

    // Determine the socket type (UDP/TCP/SCTP)
    int value = 0;
    QT_SOCKOPTLEN_T valueSize = sizeof(int);
    if (::getsockopt(socketDescriptor, SOL_SOCKET, SO_TYPE, &value, &valueSize) == 0) {
        if (value == SOCK_STREAM) {
#ifndef QT_NO_SCTP
            if (option(QNativeSocketEngine::MaxStreamsSocketOption) != -1) {
                socketType = QAbstractSocket::SctpSocket;
                if (connected) {
                    sctp_status sctpStatus;
                    QT_SOCKOPTLEN_T sctpStatusSize = sizeof(sctpStatus);
                    sctp_event_subscribe sctpEvents;

                    memset(&sctpEvents, 0, sizeof(sctpEvents));
                    sctpEvents.sctp_data_io_event = 1;
                    if (::getsockopt(socketDescriptor, SOL_SCTP, SCTP_STATUS, &sctpStatus,
                                     &sctpStatusSize) == 0 &&
                        ::setsockopt(socketDescriptor, SOL_SCTP, SCTP_EVENTS, &sctpEvents,
                                     sizeof(sctpEvents)) == 0) {
                        inboundStreamCount = int(sctpStatus.sstat_instrms);
                        outboundStreamCount = int(sctpStatus.sstat_outstrms);
                    } else {
                        setError(QAbstractSocket::UnsupportedSocketOperationError,
                                 InvalidSocketErrorString);
                        return false;
                    }
                }
            } else {
                socketType = QAbstractSocket::TcpSocket;
            }
#else
                socketType = QAbstractSocket::TcpSocket;
#endif
        } else {
            if (value == SOCK_DGRAM)
                socketType = QAbstractSocket::UdpSocket;
            else
                socketType = QAbstractSocket::UnknownSocketType;
        }
    }
#if defined (QNATIVESOCKETENGINE_DEBUG)
    QString socketProtocolStr = QStringLiteral("UnknownProtocol");
    if (socketProtocol == QAbstractSocket::IPv4Protocol) socketProtocolStr = QStringLiteral("IPv4Protocol");
    else if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) socketProtocolStr = QStringLiteral("IPv6Protocol");

    QString socketTypeStr = QStringLiteral("UnknownSocketType");
    if (socketType == QAbstractSocket::TcpSocket) socketTypeStr = QStringLiteral("TcpSocket");
    else if (socketType == QAbstractSocket::UdpSocket) socketTypeStr = QStringLiteral("UdpSocket");
    else if (socketType == QAbstractSocket::SctpSocket) socketTypeStr = QStringLiteral("SctpSocket");

    qDebug("QNativeSocketEnginePrivate::fetchConnectionParameters() local == %s:%i,"
           " peer == %s:%i, socket == %s - %s, inboundStreamCount == %i, outboundStreamCount == %i",
           localAddress.toString().toLatin1().constData(), localPort,
           peerAddress.toString().toLatin1().constData(), peerPort,socketTypeStr.toLatin1().constData(),
           socketProtocolStr.toLatin1().constData(), inboundStreamCount, outboundStreamCount);
#endif
    return true;
}